

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O2

ctmbstr getNextInstalledLanguage(TidyIterator *iter)

{
  uint uVar1;
  TidyIterator p_Var2;
  ctmbstr ptVar3;
  TidyIterator p_Var4;
  
  if (iter != (TidyIterator *)0x0) {
    p_Var4 = *iter;
    if (p_Var4 == (TidyIterator)0x0) {
      ptVar3 = (ctmbstr)0x0;
      p_Var4 = (TidyIterator)0x0;
    }
    else {
      uVar1 = prvTidytidyInstalledLanguageListSize();
      if ((TidyIterator)(ulong)uVar1 < p_Var4) {
        ptVar3 = (ctmbstr)0x0;
      }
      else {
        ptVar3 = (&tidyLanguages.fallbackLanguage)[(long)p_Var4]->messages[0].value;
        p_Var4 = (TidyIterator)((long)&p_Var4->_opaque + 1);
      }
    }
    uVar1 = prvTidytidyInstalledLanguageListSize();
    p_Var2 = (TidyIterator)0x0;
    if (p_Var4 <= (TidyIterator)(ulong)uVar1) {
      p_Var2 = p_Var4;
    }
    *iter = p_Var2;
    return ptVar3;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/language.c"
                ,0x37e,"ctmbstr getNextInstalledLanguage(TidyIterator *)");
}

Assistant:

ctmbstr getNextInstalledLanguage( TidyIterator* iter )
{
    ctmbstr item = NULL;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= TY_(tidyInstalledLanguageListSize)() )
    {
        item = tidyLanguages.languages[itemIndex - 1]->messages[0].value;
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= TY_(tidyInstalledLanguageListSize)() ? itemIndex : (size_t)0 );
    return item;
}